

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall
clipp::group::child_t<clipp::parameter,_clipp::group>::required
          (child_t<clipp::parameter,_clipp::group> *this)

{
  byte bVar1;
  bool bVar2;
  
  if (this->type_ == group) {
    bVar1 = (this->m_).group.exclusive_;
    if ((bool)bVar1 == true) {
      bVar2 = all_required((group *)this);
      if (bVar2) {
        return true;
      }
      bVar1 = (this->m_).group.exclusive_;
    }
    if ((bVar1 & 1) == 0) {
      bVar2 = any_required((group *)this);
      return bVar2;
    }
  }
  else if (this->type_ == param) {
    return (this->m_).param.required_;
  }
  return false;
}

Assistant:

bool required() const noexcept {
            switch(type_) {
                case type::param: return m_.param.required();
                case type::group:
                    return (m_.group.exclusive() && m_.group.all_required() ) ||
                          (!m_.group.exclusive() && m_.group.any_required()  );
                default: return false;
            }
        }